

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

string * __thiscall
punky::ast::CallExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,CallExpression *this)

{
  ExprNode *pEVar1;
  _Storage<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false>
  _Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  string args_str;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 uStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar1 = (this->m_function)._M_t.
           super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>.
           _M_t.
           super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
           .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
  if (pEVar1 == (ExprNode *)0x0) {
    return __return_storage_ptr__;
  }
  (*(pEVar1->super_AstNode)._vptr_AstNode[3])(&local_90);
  ExprNode::token_literal_abi_cxx11_(&local_50,&this->super_ExprNode);
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < local_50._M_string_length + local_88) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar8 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_88 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_0010af86;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
LAB_0010af86:
  local_70 = &local_60;
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_60 = *puVar6;
    uStack_58 = puVar4[3];
  }
  else {
    local_60 = *puVar6;
    local_70 = (ulong *)*puVar4;
  }
  local_68 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)puVar6 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((this->m_arguments).
      super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
      ._M_engaged == true) {
    local_68 = 0;
    local_60 = local_60 & 0xffffffffffffff00;
    _Var2 = (this->m_arguments).
            super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
            ._M_payload;
    puVar4 = *(undefined8 **)_Var2;
    puVar3 = *(undefined8 **)((long)_Var2 + 8);
    local_70 = &local_60;
    if (puVar4 != puVar3) {
      do {
        (**(code **)(*(long *)*puVar4 + 0x18))(&local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar6 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar6) {
          local_80 = *puVar6;
          lStack_78 = plVar5[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *puVar6;
          local_90 = (ulong *)*plVar5;
        }
        local_88 = plVar5[1];
        *plVar5 = (long)puVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar3);
      if (2 < local_68) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::pop_back();
      }
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70,(undefined1 *)(local_68 + (long)local_70));
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CallExpression::to_string() const
{
    std::string call_str;
    if (m_function)
    {
        call_str.append(m_function->to_string() + token_literal());
        if (m_arguments.has_value())
        {
            std::string args_str;
            for (const auto& args : *m_arguments.value())
                args_str.append(args->to_string() + ", ");
            if (args_str.size() > 2)
            {
                args_str.pop_back();
                args_str.pop_back();
            }
            call_str.append(args_str + ")");
        }
        else
            call_str.append(")");
    }
    return call_str;
}